

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_get_current_point(plutovg_path_t *path,float *x,float *y)

{
  float local_28;
  float local_24;
  float yy;
  float xx;
  float *y_local;
  float *x_local;
  plutovg_path_t *path_local;
  
  local_24 = 0.0;
  local_28 = 0.0;
  if (0 < path->num_points) {
    local_24 = (float)(path->elements).data[(path->elements).size + -1].header.command;
    local_28 = *(float *)((long)(path->elements).data + (long)((path->elements).size + -1) * 8 + 4);
  }
  if (x != (float *)0x0) {
    *x = local_24;
  }
  if (y != (float *)0x0) {
    *y = local_28;
  }
  return;
}

Assistant:

void plutovg_path_get_current_point(const plutovg_path_t* path, float* x, float* y)
{
    float xx = 0.f;
    float yy = 0.f;
    if(path->num_points > 0) {
        xx = path->elements.data[path->elements.size - 1].point.x;
        yy = path->elements.data[path->elements.size - 1].point.y;
    }

    if(x) *x = xx;
    if(y) *y = yy;
}